

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildAndTestHandler.cxx
# Opt level: O2

int __thiscall
cmCTestBuildAndTestHandler::RunCMake
          (cmCTestBuildAndTestHandler *this,string *outstring,ostringstream *out,
          string *cmakeOutString,cmake *cm)

{
  char *pcVar1;
  pointer pbVar2;
  cmCTest *pcVar3;
  int iVar4;
  string *psVar5;
  ostream *poVar6;
  uint uVar7;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string generator;
  
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&args,psVar5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&args,&this->SourceDir);
  if ((this->BuildGenerator)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&generator,"-G",(allocator *)&local_1e8);
    std::__cxx11::string::append((string *)&generator);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&args,&generator);
    std::__cxx11::string::~string((string *)&generator);
  }
  if ((this->BuildGeneratorPlatform)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&generator,"-A",(allocator *)&local_1e8);
    std::__cxx11::string::append((string *)&generator);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&args,&generator);
    std::__cxx11::string::~string((string *)&generator);
  }
  if ((this->BuildGeneratorToolset)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&generator,"-T",(allocator *)&local_1e8);
    std::__cxx11::string::append((string *)&generator);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&args,&generator);
    std::__cxx11::string::~string((string *)&generator);
  }
  psVar5 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  if (psVar5->_M_string_length != 0) {
    psVar5 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    if (pcVar1 != (char *)0x0) {
      std::__cxx11::string::string((string *)&local_1e8,pcVar1,&local_1e9);
      std::operator+(&generator,"-DCMAKE_BUILD_TYPE:STRING=",&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&args,&generator);
      std::__cxx11::string::~string((string *)&generator);
    }
  }
  uVar7 = 0;
  while( true ) {
    pbVar2 = (this->BuildOptions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->BuildOptions).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) <=
        (ulong)uVar7) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&args,pbVar2 + uVar7);
    uVar7 = uVar7 + 1;
  }
  iVar4 = cmake::Run(cm,&args);
  if (iVar4 == 0) {
    if (this->BuildTwoConfig == true) {
      iVar4 = cmake::Run(cm,&args);
      if (iVar4 != 0) {
        std::operator<<((ostream *)out,"Error: cmake execution failed\n");
        poVar6 = std::operator<<((ostream *)out,(string *)cmakeOutString);
        std::operator<<(poVar6,"\n");
        if (outstring == (string *)0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&generator);
          std::__cxx11::stringbuf::str();
          poVar6 = std::operator<<((ostream *)&generator,(string *)&local_1e8);
          std::endl<char,std::char_traits<char>>(poVar6);
          std::__cxx11::string::~string((string *)&local_1e8);
          pcVar3 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar3,6,
                       "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                       ,0x68,local_1e8._M_dataplus._M_p,false);
          goto LAB_002e933d;
        }
        std::__cxx11::stringbuf::str();
        goto LAB_002e921e;
      }
    }
    std::operator<<((ostream *)out,"======== CMake output     ======\n");
    std::operator<<((ostream *)out,(string *)cmakeOutString);
    iVar4 = 0;
    std::operator<<((ostream *)out,"======== End CMake output ======\n");
  }
  else {
    std::operator<<((ostream *)out,"Error: cmake execution failed\n");
    poVar6 = std::operator<<((ostream *)out,(string *)cmakeOutString);
    std::operator<<(poVar6,"\n");
    if (outstring == (string *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&generator);
      std::__cxx11::stringbuf::str();
      poVar6 = std::operator<<((ostream *)&generator,(string *)&local_1e8);
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::~string((string *)&local_1e8);
      pcVar3 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,6,
                   "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestBuildAndTestHandler.cxx"
                   ,0x5c,local_1e8._M_dataplus._M_p,false);
LAB_002e933d:
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&generator);
    }
    else {
      std::__cxx11::stringbuf::str();
LAB_002e921e:
      std::__cxx11::string::operator=((string *)outstring,(string *)&generator);
      std::__cxx11::string::~string((string *)&generator);
    }
    iVar4 = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  return iVar4;
}

Assistant:

int cmCTestBuildAndTestHandler::RunCMake(std::string* outstring,
                                         std::ostringstream& out,
                                         std::string& cmakeOutString,
                                         cmake* cm)
{
  unsigned int k;
  std::vector<std::string> args;
  args.push_back(cmSystemTools::GetCMakeCommand());
  args.push_back(this->SourceDir);
  if (!this->BuildGenerator.empty()) {
    std::string generator = "-G";
    generator += this->BuildGenerator;
    args.push_back(generator);
  }
  if (!this->BuildGeneratorPlatform.empty()) {
    std::string platform = "-A";
    platform += this->BuildGeneratorPlatform;
    args.push_back(platform);
  }
  if (!this->BuildGeneratorToolset.empty()) {
    std::string toolset = "-T";
    toolset += this->BuildGeneratorToolset;
    args.push_back(toolset);
  }

  const char* config = CM_NULLPTR;
  if (!this->CTest->GetConfigType().empty()) {
    config = this->CTest->GetConfigType().c_str();
  }
#ifdef CMAKE_INTDIR
  if (!config) {
    config = CMAKE_INTDIR;
  }
#endif

  if (config) {
    std::string btype = "-DCMAKE_BUILD_TYPE:STRING=" + std::string(config);
    args.push_back(btype);
  }

  for (k = 0; k < this->BuildOptions.size(); ++k) {
    args.push_back(this->BuildOptions[k]);
  }
  if (cm->Run(args) != 0) {
    out << "Error: cmake execution failed\n";
    out << cmakeOutString << "\n";
    if (outstring) {
      *outstring = out.str();
    } else {
      cmCTestLog(this->CTest, ERROR_MESSAGE, out.str() << std::endl);
    }
    return 1;
  }
  // do another config?
  if (this->BuildTwoConfig) {
    if (cm->Run(args) != 0) {
      out << "Error: cmake execution failed\n";
      out << cmakeOutString << "\n";
      if (outstring) {
        *outstring = out.str();
      } else {
        cmCTestLog(this->CTest, ERROR_MESSAGE, out.str() << std::endl);
      }
      return 1;
    }
  }
  out << "======== CMake output     ======\n";
  out << cmakeOutString;
  out << "======== End CMake output ======\n";
  return 0;
}